

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O2

bool __thiscall libtorrent::bdecode_node::has_soft_error(bdecode_node *this,span<char> error)

{
  bdecode_token *pbVar1;
  bdecode_token bVar2;
  type_t tVar3;
  uint uVar4;
  ulong uVar5;
  bdecode_token bVar6;
  int iVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int token;
  vector<int,_std::allocator<int>_> stack;
  
  tVar3 = type(this);
  if (tVar3 == none_t) {
    bVar10 = false;
  }
  else {
    pbVar1 = this->m_root_tokens;
    iVar11 = this->m_token_idx;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    token = iVar11;
    ::std::vector<int,_std::allocator<int>_>::reserve(&stack,100);
    do {
      uVar4 = SUB84(pbVar1[iVar11],0);
      switch((uint)((ulong)pbVar1[iVar11] >> 0x1d) & 7) {
      case 1:
      case 2:
        ::std::vector<int,_std::allocator<int>_>::push_back(&stack,&token);
        iVar11 = token;
        break;
      case 3:
      case 5:
        uVar5 = (ulong)(uVar4 & 0x1fffffff);
        if ((this->m_buffer[uVar5] == '0') && (this->m_buffer[uVar5 + 1] != ':')) {
          pcVar9 = "leading zero in string length";
LAB_00182bb2:
          snprintf(error.m_ptr,error.m_len,pcVar9);
          bVar10 = true;
          goto LAB_00182bc5;
        }
        break;
      case 4:
        uVar5 = (ulong)(uVar4 & 0x1fffffff);
        if ((this->m_buffer[uVar5 + 1] == '0') && (this->m_buffer[uVar5 + 2] != 'e')) {
          pcVar9 = "leading zero in integer";
          goto LAB_00182bb2;
        }
        break;
      case 6:
        iVar7 = stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish[-1];
        stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        if ((((ulong)pbVar1[iVar7] & 0xe0000000) == 0x20000000) &&
           (iVar14 = iVar7 + 1, iVar11 != iVar14)) {
          pcVar9 = this->m_buffer;
          bVar6 = pbVar1[(long)iVar7 + 1];
LAB_00182a55:
          iVar7 = (bVar6._4_4_ & 0x1fffffff) + iVar14;
          iVar14 = iVar7 + (SUB84(pbVar1[iVar7],4) & 0x1fffffff);
          if (iVar14 != iVar11) {
            bVar2 = pbVar1[iVar14];
            uVar4 = (bVar6._4_4_ >> 0x1d) + (bVar6._0_4_ & 0x1fffffff) +
                    (uint)((bVar6._0_4_ & 0xe0000000) != 0x60000000) * 8;
            iVar12 = ((SUB84(pbVar1[iVar7],0) & 0x1fffffff) - uVar4) + -2;
            uVar8 = (bVar2._4_4_ >> 0x1d) + (bVar2._0_4_ & 0x1fffffff) +
                    (uint)((bVar2._0_4_ & 0xe0000000) != 0x60000000) * 8;
            iVar13 = ((*(uint *)(pbVar1 + (int)((bVar2._4_4_ & 0x1fffffff) + iVar14)) & 0x1fffffff)
                     - uVar8) + -2;
            iVar7 = iVar12;
            if (iVar13 < iVar12) {
              iVar7 = iVar13;
            }
            iVar7 = memcmp(pcVar9 + (ulong)uVar4 + 2,pcVar9 + (ulong)uVar8 + 2,(long)iVar7);
            if (iVar7 < 1) goto code_r0x00182b2a;
            goto LAB_00182b90;
          }
        }
      }
      iVar11 = iVar11 + 1;
      token = iVar11;
    } while (stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start !=
             stack.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish);
    bVar10 = false;
LAB_00182bc5:
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&stack.super__Vector_base<int,_std::allocator<int>_>);
  }
  return bVar10;
code_r0x00182b2a:
  bVar6 = bVar2;
  if (iVar7 == 0) {
    if (iVar13 < iVar12) {
LAB_00182b90:
      pcVar9 = "unsorted dictionary key";
      goto LAB_00182bb2;
    }
    if (iVar13 == iVar12) {
      pcVar9 = "duplicate dictionary key";
      goto LAB_00182bb2;
    }
  }
  goto LAB_00182a55;
}

Assistant:

bool bdecode_node::has_soft_error(span<char> error) const
	{
		if (type() == none_t) return false;

		bdecode_token const* tokens = m_root_tokens;
		int token = m_token_idx;

		// we don't know what the original depth_limit was
		// so this has to go on the heap
		std::vector<int> stack;
		// make the initial allocation the default depth_limit
		stack.reserve(100);

		do
		{
			switch (tokens[token].type)
			{
			case bdecode_token::integer:
				if (m_buffer[tokens[token].offset + 1] == '0'
					&& m_buffer[tokens[token].offset + 2] != 'e')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in integer");
					return true;
				}
				break;
			case bdecode_token::string:
			case bdecode_token::long_string:
				if (m_buffer[tokens[token].offset] == '0'
					&& m_buffer[tokens[token].offset + 1] != ':')
				{
					std::snprintf(error.data(), std::size_t(error.size()), "leading zero in string length");
					return true;
				}
				break;
			case bdecode_token::dict:
			case bdecode_token::list:
				stack.push_back(token);
				break;
			case bdecode_token::end:
				auto const parent = stack.back();
				stack.pop_back();
				if (tokens[parent].type == bdecode_token::dict
					&& token != parent + 1)
				{
					// this is the end of a non-empty dict
					// check the sort order of the keys
					int k1 = parent + 1;
					for (;;)
					{
						// skip to the first key's value
						int const v1 = k1 + tokens[k1].next_item;
						// then to the next key
						int const k2 = v1 + tokens[v1].next_item;

						// check if k1 was the last key in the dict
						if (k2 == token)
							break;

						int const v2 = k2 + tokens[k2].next_item;

						int const k1_start = tokens[k1].offset + tokens[k1].start_offset();
						int const k1_len = tokens[v1].offset - k1_start;
						int const k2_start = tokens[k2].offset + tokens[k2].start_offset();
						int const k2_len = tokens[v2].offset - k2_start;

						int const min_len = std::min(k1_len, k2_len);

						int cmp = std::memcmp(m_buffer + k1_start, m_buffer + k2_start, std::size_t(min_len));
						if (cmp > 0 || (cmp == 0 && k1_len > k2_len))
						{
							std::snprintf(error.data(), std::size_t(error.size()), "unsorted dictionary key");
							return true;
						}
						else if (cmp == 0 && k1_len == k2_len)
						{
							std::snprintf(error.data(), std::size_t(error.size()), "duplicate dictionary key");
							return true;
						}

						k1 = k2;
					}
				}
				break;
			}

			++token;
		} while (!stack.empty());
		return false;
	}